

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::DiskSourceTreeTest::~DiskSourceTreeTest
          (DiskSourceTreeTest *this)

{
  code *pcVar1;
  DiskSourceTreeTest *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void SetUp() override {
    dirnames_.push_back(
        absl::StrCat(TestTempDir(), "/test_proto2_import_path_1"));
    dirnames_.push_back(
        absl::StrCat(TestTempDir(), "/test_proto2_import_path_2"));

    for (int i = 0; i < dirnames_.size(); i++) {
      if (FileExists(dirnames_[i])) {
        File::DeleteRecursively(dirnames_[i], NULL, NULL);
      }
      ABSL_CHECK_OK(File::CreateDir(dirnames_[i], 0777));
    }
  }